

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int strarray_cmp(strarray *a1,strarray *a2)

{
  bool bVar1;
  size_t local_30;
  size_t min_len;
  int result;
  strarray *a2_local;
  strarray *a1_local;
  
  if ((a1 == (strarray *)0x0) || (a1->value == (char *)0x0)) {
    bVar1 = true;
    if (a2 != (strarray *)0x0) {
      bVar1 = a2->value == (char *)0x0;
    }
    a1_local._4_4_ = -1;
    if (bVar1) {
      a1_local._4_4_ = 0;
    }
  }
  else if ((a2 == (strarray *)0x0) || (a2->value == (char *)0x0)) {
    a1_local._4_4_ = 1;
  }
  else {
    if (a2->length < a1->length) {
      local_30 = a2->length;
    }
    else {
      local_30 = a1->length;
    }
    a1_local._4_4_ = memcmp(a1->value,a2->value,local_30);
    if (a1_local._4_4_ == 0) {
      if (a2->length < a1->length) {
        a1_local._4_4_ = 1;
      }
      else if (a1->length < a2->length) {
        a1_local._4_4_ = -1;
      }
    }
  }
  return a1_local._4_4_;
}

Assistant:

int
strarray_cmp(const struct strarray *a1, const struct strarray *a2) {
  int result;
  size_t min_len;

  if (a1 == NULL || a1->value == NULL) {
    return (a2 == NULL || a2->value == NULL) ? 0 : -1;
  }
  if (a2 == NULL || a2->value == NULL) {
    return 1;
  }

  if (a1->length > a2->length) {
    min_len = a2->length;
  }
  else {
    min_len = a1->length;
  }

  result = memcmp(a1->value, a2->value, min_len);
  if (result == 0) {
    if (a1->length > a2->length) {
      return 1;
    }
    if (a1->length < a2->length) {
      return -1;
    }
  }
  return result;
}